

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::EnumFieldGenerator::GenerateMergeFromCodedStream
          (EnumFieldGenerator *this,Printer *printer)

{
  Printer *this_00;
  bool bVar1;
  uint32 uVar2;
  FileDescriptor *pFVar3;
  uint i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  EnumFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print(printer,&this->variables_,
                     "int value;\nDO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n       input, &value)));\n"
                    );
  pFVar3 = FieldDescriptor::file(this->descriptor_);
  bVar1 = HasPreservingUnknownEnumSemantics(pFVar3);
  if (bVar1) {
    io::Printer::Print(local_18,&this->variables_,"set_$name$(static_cast< $type$ >(value));\n");
  }
  else {
    io::Printer::Print(local_18,&this->variables_,
                       "if ($type$_IsValid(value)) {\n  set_$name$(static_cast< $type$ >(value));\n"
                      );
    pFVar3 = FieldDescriptor::file(this->descriptor_);
    bVar1 = UseUnknownFieldSet(pFVar3,(this->super_FieldGenerator).options_);
    this_00 = local_18;
    if (bVar1) {
      io::Printer::Print(local_18,&this->variables_,
                         "} else {\n  mutable_unknown_fields()->AddVarint($number$, value);\n");
    }
    else {
      uVar2 = internal::WireFormat::MakeTag(this->descriptor_);
      SimpleItoa_abi_cxx11_(&local_38,(protobuf *)(ulong)uVar2,i);
      io::Printer::Print(this_00,
                         "} else {\n  unknown_fields_stream.WriteVarint32($tag$u);\n  unknown_fields_stream.WriteVarint32(value);\n"
                         ,"tag",&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    io::Printer::Print(local_18,&this->variables_,"}\n");
  }
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  printer->Print(variables_,
    "int value;\n"
    "DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n"
    "         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n"
    "       input, &value)));\n");
  if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
    printer->Print(variables_,
      "set_$name$(static_cast< $type$ >(value));\n");
  } else {
    printer->Print(variables_,
      "if ($type$_IsValid(value)) {\n"
      "  set_$name$(static_cast< $type$ >(value));\n");
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(variables_,
        "} else {\n"
        "  mutable_unknown_fields()->AddVarint($number$, value);\n");
    } else {
      printer->Print(
        "} else {\n"
        "  unknown_fields_stream.WriteVarint32($tag$u);\n"
        "  unknown_fields_stream.WriteVarint32(value);\n",
        "tag", SimpleItoa(internal::WireFormat::MakeTag(descriptor_)));
    }
    printer->Print(variables_,
      "}\n");
  }
}